

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O1

Instr * __thiscall
IRBuilder::BuildCallI_Helper
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot dstRegSlot,RegSlot Src1RegSlot,
          ArgSlot ArgCount,ProfileId profileId,CallFlags flags,InlineCacheIndex inlineCacheIndex)

{
  IRKind IVar1;
  OpCode OVar2;
  Func *pFVar3;
  code *pcVar4;
  bool bVar5;
  bool bVar6;
  byte bVar7;
  ValueType valueType;
  RegOpnd *this_00;
  JitProfilingInstr *this_01;
  undefined4 *puVar8;
  uint uVar9;
  StackSym *symDst;
  ProfileId PVar10;
  StackSym *local_60;
  RegOpnd *local_40;
  
  this_00 = BuildSrcOpnd(this,Src1RegSlot,TyVar);
  if (dstRegSlot == 0xffffffff) {
    local_40 = (RegOpnd *)0x0;
    local_60 = (StackSym *)0x0;
  }
  else {
    local_40 = BuildDstOpnd(this,dstRegSlot,TyVar,false,false);
    local_60 = local_40->m_sym;
  }
  bVar5 = Func::DoSimpleJitDynamicProfile(this->m_func);
  bVar6 = Js::OpCodeUtil::IsProfiledReturnTypeCallOp(newOpcode);
  PVar10 = profileId;
  if (bVar6) {
    newOpcode = Js::OpCodeUtil::ConvertProfiledReturnTypeCallOpToNonProfiled(newOpcode);
    PVar10 = 0xffff;
    if (bVar5) {
      PVar10 = profileId;
    }
  }
  pFVar3 = this->m_func;
  if (PVar10 == 0xffff) {
    this_01 = (JitProfilingInstr *)IR::Instr::New(newOpcode,pFVar3);
    if ((this_01->super_Instr).m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar5) goto LAB_004da46e;
      *puVar8 = 0;
    }
    pFVar3 = (this_01->super_Instr).m_func;
    if ((this_00->super_Opnd).isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar5) goto LAB_004da46e;
      *puVar8 = 0;
    }
    bVar7 = (this_00->super_Opnd).field_0xb;
    if ((bVar7 & 2) != 0) {
      this_00 = (RegOpnd *)IR::Opnd::Copy(&this_00->super_Opnd,pFVar3);
      bVar7 = (this_00->super_Opnd).field_0xb;
    }
    (this_00->super_Opnd).field_0xb = bVar7 | 2;
    (this_01->super_Instr).m_src1 = &this_00->super_Opnd;
    if (local_40 != (RegOpnd *)0x0) {
      IR::Instr::SetDst((Instr *)this_01,&local_40->super_Opnd);
    }
  }
  else {
    if (!bVar5) {
      this_01 = (JitProfilingInstr *)
                IR::ProfiledInstr::New(newOpcode,&local_40->super_Opnd,&this_00->super_Opnd,pFVar3);
      if ((this_01->super_Instr).m_kind != InstrKindProfiled) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar8 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                           ,0xd5,"(this->IsProfiledInstr())","Bad call to AsProfiledInstr()");
        if (!bVar5) goto LAB_004da46e;
        *puVar8 = 0;
      }
      this_01->profileId = (short)(uint)PVar10;
      this_01->arrayProfileId = (short)((uint)PVar10 >> 0x10);
      goto LAB_004da3dc;
    }
    this_01 = IR::JitProfilingInstr::New
                        (newOpcode,&local_40->super_Opnd,&this_00->super_Opnd,pFVar3);
    if ((this_01->super_Instr).m_kind != InstrKindJitProfiling) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
      if (!bVar5) goto LAB_004da46e;
      *puVar8 = 0;
    }
    this_01->profileId = PVar10;
    if ((this_01->super_Instr).m_kind != InstrKindJitProfiling) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
      if (!bVar5) goto LAB_004da46e;
      *puVar8 = 0;
    }
    IVar1 = (this_01->super_Instr).m_kind;
    this_01->field_0x60 = (this_01->field_0x60 & 0xfe) + bVar6;
    if (IVar1 != InstrKindJitProfiling) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,199,"(this->IsJitProfilingInstr())","Bad call to AsProfiledInstr()");
      if (!bVar5) {
LAB_004da46e:
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
      *puVar8 = 0;
    }
    (this_01->field_2).inlineCacheIndex = inlineCacheIndex;
  }
LAB_004da3dc:
  if (newOpcode == NewScObject && local_40 != (RegOpnd *)0x0) {
    valueType = ValueType::GetObject(UninitializedObject);
    IR::Opnd::SetValueType(&local_40->super_Opnd,valueType);
  }
  if ((local_60 != (StackSym *)0x0) && ((*(uint *)&local_60->field_0x18 & 1) != 0)) {
    OVar2 = (this_01->super_Instr).m_opcode;
    uVar9 = OVar2 - 0xc4;
    if (((uVar9 < 0xb) && ((0x429U >> (uVar9 & 0x1f) & 1) != 0)) || (OVar2 == NewScObjectSpread)) {
      *(uint *)&local_60->field_0x18 = *(uint *)&local_60->field_0x18 | 6;
    }
  }
  AddInstr(this,&this_01->super_Instr,offset);
  BuildCallCommon(this,&this_01->super_Instr,symDst,ArgCount,flags);
  return &this_01->super_Instr;
}

Assistant:

IR::Instr *
IRBuilder::BuildCallI_Helper(Js::OpCode newOpcode, uint32 offset, Js::RegSlot dstRegSlot, Js::RegSlot Src1RegSlot, Js::ArgSlot ArgCount, Js::ProfileId profileId, Js::CallFlags flags, Js::InlineCacheIndex inlineCacheIndex)
{
    IR::Instr * instr;
    IR::RegOpnd *   dstOpnd;
    IR::RegOpnd *   src1Opnd;
    StackSym *      symDst;

    src1Opnd = this->BuildSrcOpnd(Src1RegSlot);
    if (dstRegSlot == Js::Constants::NoRegister)
    {
        dstOpnd = nullptr;
        symDst = nullptr;
    }
    else
    {
        dstOpnd = this->BuildDstOpnd(dstRegSlot);
        symDst = dstOpnd->m_sym;
    }

    const bool jitProfiling = m_func->DoSimpleJitDynamicProfile();
    bool profiledReturn = false;
    if (Js::OpCodeUtil::IsProfiledReturnTypeCallOp(newOpcode))
    {
        profiledReturn = true;
        newOpcode = Js::OpCodeUtil::ConvertProfiledReturnTypeCallOpToNonProfiled(newOpcode);

        // If we're profiling in the jitted code we want to propagate the profileId
        //   If we're using profile data instead of collecting it, we don't want to
        //   use the profile data from a return type call (this was previously done in IRBuilder::BuildProfiledCallI)
        if (!jitProfiling)
        {
            profileId = Js::Constants::NoProfileId;
        }
    }

    if (profileId != Js::Constants::NoProfileId)
    {
        if (jitProfiling)
        {
            // In SimpleJit we want this call to be a profiled call after being jitted
            instr = IR::JitProfilingInstr::New(newOpcode, dstOpnd, src1Opnd, m_func);
            instr->AsJitProfilingInstr()->profileId = profileId;
            instr->AsJitProfilingInstr()->isProfiledReturnCall = profiledReturn;
            instr->AsJitProfilingInstr()->inlineCacheIndex = inlineCacheIndex;
        }
        else
        {
            instr = IR::ProfiledInstr::New(newOpcode, dstOpnd, src1Opnd, m_func);
            instr->AsProfiledInstr()->u.profileId = profileId;
        }
    }
    else
    {
        instr = IR::Instr::New(newOpcode, m_func);
        instr->SetSrc1(src1Opnd);
        if (dstOpnd != nullptr)
        {
            instr->SetDst(dstOpnd);
        }
    }

    if (dstOpnd && newOpcode == Js::OpCode::NewScObject)
    {
        dstOpnd->SetValueType(ValueType::GetObject(ObjectType::UninitializedObject));
    }

    if (symDst && symDst->m_isSingleDef)
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::NewScObject:
        case Js::OpCode::NewScObjectSpread:
        case Js::OpCode::NewScObjectLiteral:
        case Js::OpCode::NewScObjArray:
        case Js::OpCode::NewScObjArraySpread:
            symDst->m_isSafeThis = true;
            symDst->m_isNotNumber = true;
            break;
        }
    }

    this->AddInstr(instr, offset);

    this->BuildCallCommon(instr, symDst, ArgCount, flags);

    return instr;
}